

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Char16Test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  char16_t *pcVar2;
  ostream *this;
  OutOfMemoryException *anon_var_0;
  DOMException *e;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_118;
  allocator<char16_t> local_f1;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_f0;
  allocator<char16_t> local_c9;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_c8;
  allocator<char16_t> local_a1;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_a0;
  undefined8 local_80;
  DOMText *devByDataVal;
  DOMElement *devByElem;
  DOMText *catDataVal;
  DOMElement *catElem;
  DOMText *prodDataVal;
  DOMElement *prodElem;
  DOMElement *rootElem;
  DOMDocument *doc;
  DOMImplementation *impl;
  char16_t *pcStack_30;
  int errorCode;
  char16_t *ns;
  XMLException *toCatch;
  undefined4 local_c;
  
  local_c = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  pcStack_30 = L"https://example.com/schema/char16";
  impl._4_4_ = 0;
  doc = (DOMDocument *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  if (doc == (DOMDocument *)0x0) {
    this = std::operator<<((ostream *)&std::cerr,"Requested DOM implementation is not supported");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    impl._4_4_ = 4;
  }
  else {
    rootElem = (DOMElement *)
               (**(code **)(*(long *)doc + 0x40))
                         (doc,pcStack_30,L"catalogue",0,
                          xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    prodElem = (DOMElement *)(**(code **)(*(long *)rootElem + 0x68))();
    prodDataVal = (DOMText *)(**(code **)(*(long *)rootElem + 0x80))(rootElem,pcStack_30,L"produit")
    ;
    (**(code **)(*(long *)prodElem + 0x88))(prodElem,prodDataVal);
    catElem = (DOMElement *)(**(code **)(*(long *)rootElem + 0x28))(rootElem,L"Xerces-C");
    (**(code **)(*(long *)prodDataVal + 0x88))(prodDataVal,catElem);
    catDataVal = (DOMText *)
                 (**(code **)(*(long *)rootElem + 0x80))(rootElem,pcStack_30,L"catégorie");
    (**(code **)(*(long *)prodElem + 0x88))(prodElem,catDataVal);
    (**(code **)(*(long *)catDataVal + 0x160))(catDataVal,L"idée",L"génial");
    devByElem = (DOMElement *)(**(code **)(*(long *)rootElem + 0x28))(rootElem,L"produit");
    (**(code **)(*(long *)catDataVal + 0x88))(catDataVal,devByElem);
    devByDataVal = (DOMText *)
                   (**(code **)(*(long *)rootElem + 0x80))(rootElem,pcStack_30,L"développéPar");
    (**(code **)(*(long *)prodElem + 0x88))(prodElem,devByDataVal);
    local_80 = (**(code **)(*(long *)rootElem + 0x28))(rootElem,L"Fondation du logiciel Apache");
    (**(code **)(*(long *)devByDataVal + 0x88))(devByDataVal,local_80);
    std::allocator<char16_t>::allocator(&local_a1);
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_a0,L"produit",&local_a1);
    pcVar2 = (char16_t *)(**(code **)(*(long *)prodDataVal + 0x140))();
    bVar1 = std::operator==(&local_a0,pcVar2);
    if (!bVar1) {
      __assert_fail("std::u16string(u\"produit\") == prodElem->getTagName()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x58,"int main()");
    }
    std::__cxx11::u16string::~u16string((u16string *)&local_a0);
    std::allocator<char16_t>::~allocator(&local_a1);
    std::allocator<char16_t>::allocator(&local_c9);
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_c8,L"catégorie",&local_c9);
    pcVar2 = (char16_t *)(**(code **)(*(long *)catDataVal + 0x140))();
    bVar1 = std::operator==(&local_c8,pcVar2);
    if (!bVar1) {
      __assert_fail(anon_var_dwarf_2421,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x59,"int main()");
    }
    std::__cxx11::u16string::~u16string((u16string *)&local_c8);
    std::allocator<char16_t>::~allocator(&local_c9);
    std::allocator<char16_t>::allocator(&local_f1);
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_f0,L"génial",&local_f1);
    pcVar2 = (char16_t *)(**(code **)(*(long *)catDataVal + 0x148))(catDataVal,L"idée");
    bVar1 = std::operator==(&local_f0,pcVar2);
    if (!bVar1) {
      __assert_fail(anon_var_dwarf_2437,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x5a,"int main()");
    }
    std::__cxx11::u16string::~u16string((u16string *)&local_f0);
    std::allocator<char16_t>::~allocator(&local_f1);
    std::allocator<char16_t>::allocator((allocator<char16_t> *)((long)&e + 7));
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>
              ((u16string *)&local_118,L"développéPar",(allocator<char16_t> *)((long)&e + 7));
    pcVar2 = (char16_t *)(**(code **)(*(long *)devByDataVal + 0x140))();
    bVar1 = std::operator==(&local_118,pcVar2);
    if (!bVar1) {
      __assert_fail(anon_var_dwarf_244d,
                    "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/Char16Test/Char16Test.cpp"
                    ,0x5b,"int main()");
    }
    std::__cxx11::u16string::~u16string((u16string *)&local_118);
    std::allocator<char16_t>::~allocator((allocator<char16_t> *)((long)&e + 7));
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return impl._4_4_;
}

Assistant:

int main() {
    try
    {
        xercesc::XMLPlatformUtils::Initialize();
    }
    catch (const xercesc::XMLException& toCatch)
    {
      std::cerr << "Error during initialization of xerces-c: "
                << toCatch.getMessage()
                << std::endl;
        return 1;
    }

    const char16_t *ns = u"https://example.com/schema/char16";

    int errorCode = 0;

    xercesc::DOMImplementation* impl = xercesc::DOMImplementationRegistry::getDOMImplementation(u"LS");
    if(impl)
    {
        try
        {
            xercesc::DOMDocument* doc = impl->createDocument
                (ns, // root element namespace URI.
                 u"catalogue", // root element name
                 nullptr);

            xercesc::DOMElement* rootElem = doc->getDocumentElement();

            xercesc::DOMElement*  prodElem = doc->createElementNS(ns, u"produit");
            rootElem->appendChild(prodElem);

            xercesc::DOMText*    prodDataVal = doc->createTextNode(u"Xerces-C");
            prodElem->appendChild(prodDataVal);

            xercesc::DOMElement*  catElem = doc->createElementNS(ns, u"catégorie");
            rootElem->appendChild(catElem);

            catElem->setAttribute(u"idée", u"génial");

            xercesc::DOMText*    catDataVal = doc->createTextNode(u"produit");
            catElem->appendChild(catDataVal);

            xercesc::DOMElement*  devByElem = doc->createElementNS(ns, u"développéPar");
            rootElem->appendChild(devByElem);

            xercesc::DOMText*    devByDataVal = doc->createTextNode(u"Fondation du logiciel Apache");
            devByElem->appendChild(devByDataVal);

            assert(std::u16string(u"produit") == prodElem->getTagName());
            assert(std::u16string(u"catégorie") == catElem->getTagName());
            assert(std::u16string(u"génial") == catElem->getAttribute(u"idée"));
            assert(std::u16string(u"développéPar") == devByElem->getTagName());
        }
        catch (const xercesc::OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorCode = 5;
        }
        catch (const xercesc::DOMException& e)
        {
            std::cerr << "DOMException code is:  " << e.code << std::endl;
            errorCode = 2;
        }
        catch (...)
        {
            std::cerr << "An error occurred creating the document" << std::endl;
            errorCode = 3;
        }
    }
    else
    {
        std::cerr << "Requested DOM implementation is not supported" << std::endl;
        errorCode = 4;
    }

    xercesc::XMLPlatformUtils::Terminate();
    return errorCode;
}